

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_types.h
# Opt level: O2

Quat * cp::rpy2q(Quat *__return_storage_ptr__,double roll,double pitch,double yaw)

{
  QuaternionType local_108;
  DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_e0 [32];
  AngleAxis<double> local_c0;
  DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_a0 [32];
  AngleAxis<double> local_80;
  DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_60 [32];
  AngleAxis<double> local_40;
  
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitX();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_40,local_60);
  local_40.m_angle = roll;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitY();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_80,local_a0);
  local_80.m_angle = pitch;
  Eigen::AngleAxis<double>::operator*(&local_108,&local_40,&local_80);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_c0,local_e0);
  local_c0.m_angle = yaw;
  Eigen::operator*(__return_storage_ptr__,&local_108,&local_c0);
  return __return_storage_ptr__;
}

Assistant:

inline Quat rpy2q(double roll, double pitch, double yaw) {
  Quat q = AngleAxisd(roll, Vector3::UnitX())
           * AngleAxisd(pitch, Vector3::UnitY())
           * AngleAxisd(yaw,   Vector3::UnitZ());
  return q;
}